

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O0

void ddReportRefMess(DdManager *unique,int i,char *caller)

{
  char *caller_local;
  int i_local;
  DdManager *unique_local;
  
  if (i == 0x7fffffff) {
    fprintf((FILE *)unique->err,"%s: problem in constants\n",caller);
  }
  else if (i != -1) {
    fprintf((FILE *)unique->err,"%s: problem in table %d\n",caller,(ulong)(uint)i);
  }
  fprintf((FILE *)unique->err,"  dead count != deleted\n");
  fprintf((FILE *)unique->err,
          "  This problem is often due to a missing call to Cudd_Ref\n  or to an extra call to Cudd_RecursiveDeref.\n  See the CUDD Programmer\'s Guide for additional details."
         );
  abort();
}

Assistant:

static void
ddReportRefMess(
  DdManager *unique /* manager */,
  int i /* table in which the problem occurred */,
  const char *caller /* procedure that detected the problem */)
{
    if (i == CUDD_CONST_INDEX) {
        (void) fprintf(unique->err,
                           "%s: problem in constants\n", caller);
    } else if (i != -1) {
        (void) fprintf(unique->err,
                           "%s: problem in table %d\n", caller, i);
    }
    (void) fprintf(unique->err, "  dead count != deleted\n");
    (void) fprintf(unique->err, "  This problem is often due to a missing \
call to Cudd_Ref\n  or to an extra call to Cudd_RecursiveDeref.\n  \
See the CUDD Programmer's Guide for additional details.");
    abort();

}